

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeMeshes.cpp
# Opt level: O2

void __thiscall
Assimp::OptimizeMeshesProcess::FindInstancedMeshes(OptimizeMeshesProcess *this,aiNode *pNode)

{
  pointer pMVar1;
  uint i;
  ulong uVar2;
  uint i_1;
  
  for (uVar2 = 0; uVar2 < pNode->mNumMeshes; uVar2 = uVar2 + 1) {
    pMVar1 = (this->meshes).
             super__Vector_base<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
             ._M_impl.super__Vector_impl_data._M_start + pNode->mMeshes[uVar2];
    pMVar1->instance_cnt = pMVar1->instance_cnt + 1;
  }
  for (uVar2 = 0; uVar2 < pNode->mNumChildren; uVar2 = uVar2 + 1) {
    FindInstancedMeshes(this,pNode->mChildren[uVar2]);
  }
  return;
}

Assistant:

void OptimizeMeshesProcess::FindInstancedMeshes (aiNode* pNode)
{
    for( unsigned int i = 0; i < pNode->mNumMeshes; ++i ) {
        ++meshes[ pNode->mMeshes[ i ] ].instance_cnt;
    }

    for( unsigned int i = 0; i < pNode->mNumChildren; ++i ) {
        FindInstancedMeshes( pNode->mChildren[ i ] );
    }
}